

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  GCproto *pGVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  GCproto *pGVar5;
  GCproto *pGVar6;
  TRef TVar7;
  long lVar8;
  int k;
  GCproto *pGVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  
  pGVar1 = J->pt + 1;
  pGVar6 = (GCproto *)(endpc + -1);
  pGVar9 = (GCproto *)endpc;
  do {
    pGVar5 = pGVar6;
    if (pGVar5 <= pGVar1) {
      return 0;
    }
    uVar2 = *(uint *)((long)&pGVar9[-1].varinfo.ptr64 + 4);
    uVar10 = uVar2 & 0xff;
    if ((lj_bc_mode[uVar10] & 7) == 1) {
      if ((uVar2 >> 8 & 0xff) == slot) {
        if (1 < uVar10 - 0x29) {
          return 0;
        }
        pGVar9 = (GCproto *)((long)&pGVar9[-1].varinfo.ptr64 + 4);
        if (pGVar1 < pGVar9) {
          lVar8 = -0x20004;
          do {
            uVar3 = (uint)(pGVar9->nextgc).gcptr64;
            if ((((char)uVar3 == 'X') &&
                (uVar11 = (ulong)(uVar3 >> 0x10), -8 < (long)(lVar8 + uVar11 * 4))) &&
               ((BCIns *)((long)pGVar9 + uVar11 * 4 + -0x1fffc) <= endpc)) {
              return 0;
            }
            pGVar9 = (GCproto *)((long)&pGVar9[-1].varinfo.ptr64 + 4);
            lVar8 = lVar8 + -4;
          } while (pGVar1 < pGVar9);
        }
        if (uVar10 == 0x29) {
          k = (int)uVar2 >> 0x10;
          if (t == IRT_INT) {
LAB_001533dc:
            TVar7 = lj_ir_kint(J,k);
            return TVar7;
          }
          dVar12 = (double)k;
        }
        else {
          uVar4 = (J->pt->k).ptr64;
          if (t == IRT_INT) {
            dVar12 = *(double *)(uVar4 + (ulong)(uVar2 >> 0x10) * 8);
            if (dVar12 != (double)(int)dVar12) {
              return 0;
            }
            if (NAN(dVar12) || NAN((double)(int)dVar12)) {
              return 0;
            }
            k = (int)dVar12;
            goto LAB_001533dc;
          }
          dVar12 = *(double *)(uVar4 + (ulong)(uVar2 >> 0x10) * 8);
        }
        TVar7 = lj_ir_knum_u64(J,(uint64_t)dVar12);
        return TVar7;
      }
    }
    else if (((lj_bc_mode[uVar10] & 7) == 2) && ((uVar2 >> 8 & 0xff) <= slot)) {
      return 0;
    }
    pGVar6 = (GCproto *)((long)&pGVar5[-1].varinfo.ptr64 + 4);
    pGVar9 = pGVar5;
  } while( true );
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}